

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O0

void __thiscall FParseContext::ParseLump(FParseContext *this,char *lumpname)

{
  ParseFunc p_Var1;
  void *pvVar2;
  FParseToken FVar3;
  int iVar4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  char *local_90;
  char *sourcep;
  char *lumpdata;
  int lumplen;
  int lumpno;
  FParseToken token;
  char *SavedSourceFile;
  int SavedSourceLine;
  int tokentype;
  char *lumpname_local;
  FParseContext *this_local;
  
  SavedSourceFile._0_4_ = this->SourceLine;
  token._72_8_ = this->SourceFile;
  _SavedSourceLine = lumpname;
  lumpname_local = (char *)this;
  lumpdata._4_4_ = FWadCollection::CheckNumForFullName(&Wads,lumpname,true,0);
  if (lumpdata._4_4_ == -1) {
    Printf("%s, line %d: Lump \'%s\' not found\n",this->SourceFile,(ulong)(uint)this->SourceLine,
           _SavedSourceLine);
  }
  else {
    lumpdata._0_4_ = FWadCollection::LumpLength(&Wads,lumpdata._4_4_);
    sourcep = (char *)operator_new__((long)((int)lumpdata + 1));
    FWadCollection::ReadLump(&Wads,lumpdata._4_4_,sourcep);
    sourcep[(int)lumpdata] = '\0';
    this->SourceLine = 0;
    this->SourceFile = _SavedSourceLine;
    local_90 = sourcep;
    while (iVar4 = GetToken(this,&local_90,(FParseToken *)&lumplen), SavedSourceFile._4_4_ = iVar4,
          iVar4 != 0) {
      if (iVar4 == this->TokenTrans[0x1a]) {
        iVar4 = GetToken(this,&local_90,(FParseToken *)&lumplen);
        if (iVar4 != this->TokenTrans[0x19]) {
          Printf("%s, line %d: Include: String parameter expected\n",this->SourceFile,
                 (ulong)(uint)this->SourceLine);
          return;
        }
        ParseLump(this,(char *)&lumplen);
      }
      else {
        p_Var1 = this->Parse;
        pvVar2 = this->pParser;
        memcpy(&local_e0,&lumplen,0x50);
        FVar3._8_8_ = uStack_d8;
        FVar3.fval = (double)local_e0;
        FVar3._16_8_ = local_d0;
        FVar3._24_8_ = uStack_c8;
        FVar3._32_8_ = local_c0;
        FVar3._40_8_ = uStack_b8;
        FVar3._48_8_ = local_b0;
        FVar3._56_8_ = uStack_a8;
        FVar3._64_8_ = local_a0;
        FVar3._72_8_ = uStack_98;
        (*p_Var1)(pvVar2,iVar4,FVar3,this);
      }
    }
    if (sourcep != (char *)0x0) {
      operator_delete__(sourcep);
    }
    this->SourceLine = (int)SavedSourceFile;
    this->SourceFile = (char *)token._72_8_;
  }
  return;
}

Assistant:

void FParseContext::ParseLump(const char *lumpname)
{
	int tokentype;
	int SavedSourceLine = SourceLine;
	const char *SavedSourceFile = SourceFile;
	FParseToken token;

	int lumpno = Wads.CheckNumForFullName(lumpname, true);

	if (lumpno == -1) 
	{
		Printf ("%s, line %d: Lump '%s' not found\n", SourceFile, SourceLine, lumpname);
		return;
	}

	// Read the lump into a buffer and add a 0-terminator
	int lumplen = Wads.LumpLength(lumpno);
	char *lumpdata = new char[lumplen+1];
	Wads.ReadLump(lumpno, lumpdata);
	lumpdata[lumplen] = 0;

	SourceLine = 0;
	SourceFile = lumpname;

	char *sourcep = lumpdata;
	while ( (tokentype = GetToken(sourcep, &token)) )
	{
		// It is much easier to handle include statements outside the main parser.
		if (tokentype == TokenTrans[INCLUDE])
		{
			if (GetToken(sourcep, &token) != TokenTrans[STRING])
			{
				Printf("%s, line %d: Include: String parameter expected\n", SourceFile, SourceLine);
				return;
			}
			ParseLump(token.string);
		}
		else
		{
			Parse(pParser, tokentype, token, this);
		}
	}
	delete [] lumpdata;
	SourceLine = SavedSourceLine;
	SourceFile = SavedSourceFile;
}